

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::peer_connection::received_piece(peer_connection *this,piece_index_t index)

{
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar1;
  pointer *ppsVar2;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar3;
  __uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> _Var4;
  int iVar5;
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  _Var6;
  uint uVar7;
  uint uVar8;
  uint local_14;
  
  local_14 = index.m_val;
  iVar5 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])();
  if ((char)iVar5 == '\0') {
    peer_log(this,incoming,"RECEIVED","piece: %d",(ulong)local_14);
    _Var6 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const>>
                      ((this->m_suggested_pieces).
                       super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       .
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->m_suggested_pieces).
                       super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       .
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_14);
    psVar3 = (this->m_suggested_pieces).
             super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             .
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (_Var6._M_current != psVar3) {
      psVar1 = _Var6._M_current + 1;
      if (psVar1 != psVar3) {
        memmove(_Var6._M_current,psVar1,(long)psVar3 - (long)psVar1);
      }
      ppsVar2 = &(this->m_suggested_pieces).
                 super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 .
                 super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppsVar2 = *ppsVar2 + -1;
    }
    _Var6 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const>>
                      ((this->m_allowed_fast).
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->m_allowed_fast).
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_14);
    psVar3 = (this->m_allowed_fast).
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (_Var6._M_current != psVar3) {
      psVar1 = _Var6._M_current + 1;
      if (psVar1 != psVar3) {
        memmove(_Var6._M_current,psVar1,(long)psVar3 - (long)psVar1);
      }
      ppsVar2 = &(this->m_allowed_fast).
                 super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppsVar2 = *ppsVar2 + -1;
    }
    _Var4._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
         (this->super_peer_connection_hot_members).m_have_piece.super_bitfield.m_buf.
         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t;
    if (((_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)
         _Var4._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) &&
       (*(int *)_Var4._M_t.
                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != 0)) {
      uVar7 = local_14 + 0x1f;
      if (-1 < (int)local_14) {
        uVar7 = local_14;
      }
      uVar8 = 0x80000000 >> ((byte)local_14 & 0x1f);
      if ((*(uint *)((long)_Var4._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                    ((long)((int)uVar7 >> 5) + 1) * 4) &
          (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18)) != 0) {
        update_interest(this);
        iVar5 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this);
        if ((char)iVar5 != '\0') {
          return;
        }
      }
    }
    disconnect_if_redundant(this);
  }
  return;
}

Assistant:

void peer_connection::received_piece(piece_index_t const index)
	{
		TORRENT_ASSERT(is_single_thread());
		// dont announce during handshake
		if (in_handshake()) return;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::incoming, "RECEIVED", "piece: %d"
			, static_cast<int>(index));
#endif

		// remove suggested pieces once we have them
		auto i = std::find(m_suggested_pieces.begin(), m_suggested_pieces.end(), index);
		if (i != m_suggested_pieces.end()) m_suggested_pieces.erase(i);

		// remove allowed fast pieces
		i = std::find(m_allowed_fast.begin(), m_allowed_fast.end(), index);
		if (i != m_allowed_fast.end()) m_allowed_fast.erase(i);

		if (has_piece(index))
		{
			// if we got a piece that this peer has
			// it might have been the last interesting
			// piece this peer had. We might not be
			// interested anymore
			update_interest();
			if (is_disconnecting()) return;
		}

		if (disconnect_if_redundant()) return;

#if TORRENT_USE_ASSERTS
		auto t = m_torrent.lock();
		TORRENT_ASSERT(t);
#endif
	}